

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MergeSimilarFunctions.cpp
# Opt level: O3

bool __thiscall
wasm::EquivalentClass::deriveParams
          (EquivalentClass *this,Module *module,
          vector<wasm::ParamInfo,_std::allocator<wasm::ParamInfo>_> *params,
          bool isCallIndirectionEnabled)

{
  ParamInfo *this_00;
  pointer ppFVar1;
  Function *pFVar2;
  Expression *pEVar3;
  Expression *pEVar4;
  uintptr_t uVar5;
  uintptr_t uVar6;
  pointer pPVar7;
  pointer pppEVar8;
  char *pcVar9;
  DeepValueIterator *pDVar10;
  DeepValueIterator *pDVar11;
  vector<wasm::ParamInfo,_std::allocator<wasm::ParamInfo>_> *this_01;
  pointer pDVar12;
  uint uVar13;
  bool bVar14;
  ulong uVar15;
  DeepValueIterator *pDVar16;
  pointer pNVar17;
  Expression **ppEVar18;
  undefined7 in_register_00000009;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  pointer pPVar22;
  DeepValueIterator *pDVar23;
  DeepValueIterator *pDVar24;
  pointer ppFVar25;
  Literal *other;
  byte bVar26;
  initializer_list<wasm::Expression_**> __l;
  _Variant_storage<false,_wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
  local_240;
  undefined1 local_200 [8];
  DeepValueIterator primaryIt;
  void *local_150;
  long local_140;
  undefined1 auStack_138 [8];
  ConstDiff diff;
  Literals values;
  vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> local_b8;
  DeepValueIterator *local_a0;
  char *local_98;
  vector<wasm::ParamInfo,_std::allocator<wasm::ParamInfo>_> *local_90;
  undefined1 auStack_88 [8];
  vector<wasm::Name,_std::allocator<wasm::Name>_> names;
  bool __ret;
  vector<DeepValueIterator,_std::allocator<DeepValueIterator>_> siblingIterators;
  allocator_type local_35;
  uint local_34;
  
  bVar26 = 0;
  local_98 = (this->primaryFunction->super_Importable).module.super_IString.str._M_str;
  if (local_98 == (char *)0x0) {
    local_34 = (uint)CONCAT71(in_register_00000009,isCallIndirectionEnabled);
    local_90 = params;
    deriveParams(wasm::Module*,std::vector<wasm::ParamInfo,std::allocator<wasm::ParamInfo>>&,bool)::
    DeepValueIterator::DeepValueIterator(wasm::Expression___(local_200,&this->primaryFunction->body)
    ;
    ___ret = (DeepValueIterator *)0x0;
    siblingIterators.super__Vector_base<DeepValueIterator,_std::allocator<DeepValueIterator>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    siblingIterators.super__Vector_base<DeepValueIterator,_std::allocator<DeepValueIterator>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ppFVar25 = (this->functions).
               super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    ppFVar1 = (this->functions).
              super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if ((ulong)((long)ppFVar1 - (long)ppFVar25) < 9) {
      __assert_fail("functions.size() >= 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/MergeSimilarFunctions.cpp"
                    ,0x178,
                    "bool wasm::EquivalentClass::deriveParams(Module *, std::vector<ParamInfo> &, bool)"
                   );
    }
    ppFVar25 = ppFVar25 + 1;
    if (ppFVar25 != ppFVar1) {
      do {
        pDVar12 = siblingIterators.
                  super__Vector_base<DeepValueIterator,_std::allocator<DeepValueIterator>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pFVar2 = *ppFVar25;
        if (siblingIterators.
            super__Vector_base<DeepValueIterator,_std::allocator<DeepValueIterator>_>._M_impl.
            super__Vector_impl_data._M_start ==
            siblingIterators.
            super__Vector_base<DeepValueIterator,_std::allocator<DeepValueIterator>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          if ((long)siblingIterators.
                    super__Vector_base<DeepValueIterator,_std::allocator<DeepValueIterator>_>.
                    _M_impl.super__Vector_impl_data._M_start - (long)___ret == 0x7fffffffffffffc0) {
            std::__throw_length_error("vector::_M_realloc_insert");
          }
          lVar20 = (long)siblingIterators.
                         super__Vector_base<DeepValueIterator,_std::allocator<DeepValueIterator>_>.
                         _M_impl.super__Vector_impl_data._M_start - (long)___ret >> 4;
          uVar21 = lVar20 * 0x6db6db6db6db6db7;
          local_a0 = ___ret;
          uVar15 = uVar21;
          if (siblingIterators.
              super__Vector_base<DeepValueIterator,_std::allocator<DeepValueIterator>_>._M_impl.
              super__Vector_impl_data._M_start == ___ret) {
            uVar15 = 1;
          }
          uVar19 = uVar15 + uVar21;
          if (0x124924924924923 < uVar19) {
            uVar19 = 0x124924924924924;
          }
          if (CARRY8(uVar15,uVar21)) {
            uVar19 = 0x124924924924924;
          }
          if (uVar19 == 0) {
            pDVar16 = (DeepValueIterator *)0x0;
          }
          else {
            pDVar16 = (DeepValueIterator *)operator_new(uVar19 * 0x70);
          }
          deriveParams(wasm::Module*,std::vector<wasm::ParamInfo,std::allocator<wasm::
          ParamInfo>>&,bool)::DeepValueIterator::DeepValueIterator(wasm::Expression___
                    ((pDVar16->tasks).fixed._M_elems + lVar20 * 2 + -1,&pFVar2->body);
          pDVar10 = pDVar16;
          for (pDVar11 = local_a0; pDVar12 != pDVar11; pDVar11 = pDVar11 + 1) {
            pDVar23 = pDVar11;
            pDVar24 = pDVar10;
            for (lVar20 = 0xb; lVar20 != 0; lVar20 = lVar20 + -1) {
              (pDVar24->tasks).usedFixed = (pDVar23->tasks).usedFixed;
              pDVar23 = (DeepValueIterator *)((long)pDVar23 + (ulong)bVar26 * -0x10 + 8);
              pDVar24 = (DeepValueIterator *)((long)pDVar24 + (ulong)bVar26 * -0x10 + 8);
            }
            pppEVar8 = (pDVar11->tasks).flexible.
                       super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            (pDVar10->tasks).flexible.
            super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pDVar11->tasks).flexible.
                 super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                 _M_impl.super__Vector_impl_data._M_start;
            (pDVar10->tasks).flexible.
            super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
            super__Vector_impl_data._M_finish = pppEVar8;
            (pDVar10->tasks).flexible.
            super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 (pDVar11->tasks).flexible.
                 super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
            (pDVar11->tasks).flexible.
            super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            (pDVar11->tasks).flexible.
            super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            (pDVar11->tasks).flexible.
            super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            pDVar10 = pDVar10 + 1;
          }
          if (local_a0 != (DeepValueIterator *)0x0) {
            operator_delete(local_a0,(long)siblingIterators.
                                           super__Vector_base<DeepValueIterator,_std::allocator<DeepValueIterator>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_a0);
          }
          siblingIterators.super__Vector_base<DeepValueIterator,_std::allocator<DeepValueIterator>_>
          ._M_impl.super__Vector_impl_data._M_finish = pDVar16 + uVar19;
          ___ret = pDVar16;
        }
        else {
          deriveParams(wasm::Module*,std::vector<wasm::ParamInfo,std::allocator<wasm::
          ParamInfo>>&,bool)::DeepValueIterator::DeepValueIterator(wasm::Expression___
                    (siblingIterators.
                     super__Vector_base<DeepValueIterator,_std::allocator<DeepValueIterator>_>.
                     _M_impl.super__Vector_impl_data._M_start,&pFVar2->body);
          pDVar10 = pDVar12;
        }
        siblingIterators.super__Vector_base<DeepValueIterator,_std::allocator<DeepValueIterator>_>.
        _M_impl.super__Vector_impl_data._M_start = pDVar10 + 1;
        ppFVar25 = ppFVar25 + 1;
      } while (ppFVar25 !=
               (this->functions).
               super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    local_34 = local_34 ^ 1;
    while (uVar13 = local_34,
          ((long)primaryIt.tasks.flexible.
                 super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                 _M_impl.super__Vector_impl_data._M_start - (long)primaryIt.tasks.fixed._M_elems[9]
          >> 3) + (long)local_200 != 0) {
      pNVar17 = (pointer)deriveParams::DeepValueIterator::operator*((DeepValueIterator *)local_200);
      pDVar12 = siblingIterators.
                super__Vector_base<DeepValueIterator,_std::allocator<DeepValueIterator>_>._M_impl.
                super__Vector_impl_data._M_start;
      diff.
      super__Variant_base<wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>.
      super__Move_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Copy_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Move_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Copy_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Variant_storage_alias<wasm::Literals,_std::vector<wasm::Name>_>._M_u._M_first.
      _M_storage._M_storage[0x28] = '\0';
      diff.
      super__Variant_base<wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>.
      super__Move_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Copy_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Move_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Copy_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Variant_storage_alias<wasm::Literals,_std::vector<wasm::Name>_>._M_u._41_8_ = 0;
      diff.
      super__Variant_base<wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>.
      super__Move_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Copy_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Move_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Copy_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Variant_storage_alias<wasm::Literals,_std::vector<wasm::Name>_>._M_u._24_8_ = 0;
      diff.
      super__Variant_base<wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>.
      super__Move_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Copy_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Move_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Copy_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Variant_storage_alias<wasm::Literals,_std::vector<wasm::Name>_>._M_u._M_first.
      _M_storage._M_storage[0x20] = '\0';
      diff.
      super__Variant_base<wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>.
      super__Move_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Copy_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Move_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Copy_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Variant_storage_alias<wasm::Literals,_std::vector<wasm::Name>_>._M_u._33_7_ = 0;
      diff.
      super__Variant_base<wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>.
      super__Move_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Copy_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Move_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Copy_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Variant_storage_alias<wasm::Literals,_std::vector<wasm::Name>_>._M_u._8_8_ = 0;
      diff.
      super__Variant_base<wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>.
      super__Move_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Copy_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Move_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Copy_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Variant_storage_alias<wasm::Literals,_std::vector<wasm::Name>_>._M_u._16_8_ = 0;
      auStack_138 = (undefined1  [8])0x0;
      diff.
      super__Variant_base<wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>.
      super__Move_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Copy_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Move_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Copy_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Variant_storage_alias<wasm::Literals,_std::vector<wasm::Name>_>._M_u._0_8_ = 0;
      values.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
      values.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 0;
      values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.super_IString.str.
      _M_str = (char *)0x0;
      diff.
      super__Variant_base<wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>.
      super__Move_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Copy_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Move_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Copy_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Variant_storage_alias<wasm::Literals,_std::vector<wasm::Name>_>._M_index = '\0';
      diff.
      super__Variant_base<wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>.
      super__Move_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Copy_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Move_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Copy_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Variant_storage_alias<wasm::Literals,_std::vector<wasm::Name>_>._57_7_ = 0;
      values.super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
      names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      auStack_88 = (undefined1  [8])0x0;
      names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      pEVar3 = (Expression *)(pNVar17->super_IString).str._M_len;
      if (pEVar3->_id == ConstId) {
        SmallVector<wasm::Literal,_1UL>::push_back
                  ((SmallVector<wasm::Literal,_1UL> *)
                   ((long)&diff.
                           super__Variant_base<wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
                           .super__Move_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                           super__Copy_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                           super__Move_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                           super__Copy_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                           super__Variant_storage_alias<wasm::Literals,_std::vector<wasm::Name>_> +
                   0x38),(Literal *)(pEVar3 + 1));
        pDVar12 = siblingIterators.
                  super__Vector_base<DeepValueIterator,_std::allocator<DeepValueIterator>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (___ret == siblingIterators.
                      super__Vector_base<DeepValueIterator,_std::allocator<DeepValueIterator>_>.
                      _M_impl.super__Vector_impl_data._M_start) {
          bVar26 = 1;
        }
        else {
          bVar26 = 1;
          pDVar16 = ___ret;
          do {
            ppEVar18 = deriveParams::DeepValueIterator::operator*(pDVar16);
            deriveParams::DeepValueIterator::operator++(pDVar16);
            if ((*ppEVar18)->_id != ConstId) {
              handle_unreachable("all sibling functions should have the same instruction type",
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/MergeSimilarFunctions.cpp"
                                 ,0x18e);
            }
            other = (Literal *)(*ppEVar18 + 1);
            bVar14 = Literal::operator==((Literal *)(pEVar3 + 1),other);
            SmallVector<wasm::Literal,_1UL>::push_back
                      ((SmallVector<wasm::Literal,_1UL> *)
                       ((long)&diff.
                               super__Variant_base<wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
                               .super__Move_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                               super__Copy_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                               super__Move_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                               super__Copy_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                               super__Variant_storage_alias<wasm::Literals,_std::vector<wasm::Name>_>
                       + 0x38),other);
            bVar26 = bVar26 & bVar14;
            pDVar16 = pDVar16 + 1;
          } while (pDVar16 != pDVar12);
        }
        std::variant<wasm::Literals,std::vector<wasm::Name,std::allocator<wasm::Name>>>::operator=
                  ((variant<wasm::Literals,std::vector<wasm::Name,std::allocator<wasm::Name>>> *)
                   auStack_138,
                   (Literals *)
                   ((long)&diff.
                           super__Variant_base<wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
                           .super__Move_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                           super__Copy_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                           super__Move_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                           super__Copy_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                           super__Variant_storage_alias<wasm::Literals,_std::vector<wasm::Name>_> +
                   0x38));
LAB_007aff91:
        if (bVar26 == 0) {
          pPVar7 = (local_90->super__Vector_base<wasm::ParamInfo,_std::allocator<wasm::ParamInfo>_>)
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pPVar22 = (local_90->
                         super__Vector_base<wasm::ParamInfo,_std::allocator<wasm::ParamInfo>_>).
                         _M_impl.super__Vector_impl_data._M_start; pPVar22 != pPVar7;
              pPVar22 = pPVar22 + 1) {
            names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 (pointer)CONCAT71(names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,1);
            primaryIt.tasks.flexible.
            super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 (pointer)&names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage;
            (*std::__detail::__variant::
              __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:1232:3)_&&,_const_std::variant<wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_&>
              ::_S_vtable._M_arr
              [(long)(char)diff.
                           super__Variant_base<wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
                           .super__Move_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                           super__Copy_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                           super__Move_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                           super__Copy_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                           super__Variant_storage_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                           _M_u._M_first._M_storage._M_storage[0x30] + 1]._M_data)
                      ((anon_class_16_2_9763bfdf_conflict1 *)
                       &primaryIt.tasks.flexible.
                        super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (variant<wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
                        *)auStack_138);
            if ((char)names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage == '\x01') {
              primaryIt.tasks.flexible.
              super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)pNVar17;
              std::vector<wasm::Expression**,std::allocator<wasm::Expression**>>::
              emplace_back<wasm::Expression**>
                        ((vector<wasm::Expression**,std::allocator<wasm::Expression**>> *)
                         &pPVar22->uses,
                         (Expression ***)
                         &primaryIt.tasks.flexible.
                          super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              goto LAB_007b00bf;
            }
          }
          std::__detail::__variant::
          _Copy_ctor_base<false,_wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
          ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
                             *)&local_240,
                            (_Copy_ctor_base<false,_wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
                             *)auStack_138);
          __l._M_len = 1;
          __l._M_array = (iterator)
                         &names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage;
          names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = pNVar17;
          std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::vector
                    (&local_b8,__l,&local_35);
          this_01 = local_90;
          this_00 = (ParamInfo *)
                    &primaryIt.tasks.flexible.
                     super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
          ParamInfo::ParamInfo(this_00,(ConstDiff *)&local_240,&local_b8);
          std::vector<wasm::ParamInfo,_std::allocator<wasm::ParamInfo>_>::
          emplace_back<wasm::ParamInfo>(this_01,this_00);
          if (local_150 != (void *)0x0) {
            operator_delete(local_150,local_140 - (long)local_150);
          }
          std::__detail::__variant::
          _Variant_storage<false,_wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
          ::~_Variant_storage((_Variant_storage<false,_wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
                               *)this_00);
          if (local_b8.super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_b8.
                            super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_b8.
                                  super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_b8.
                                  super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          std::__detail::__variant::
          _Variant_storage<false,_wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
          ::~_Variant_storage(&local_240);
        }
      }
      else {
        pDVar16 = ___ret;
        if (pEVar3->_id == CallId && (char)uVar13 == '\0') {
          std::vector<wasm::Name,std::allocator<wasm::Name>>::_M_realloc_insert<wasm::Name_const&>
                    ((vector<wasm::Name,std::allocator<wasm::Name>> *)auStack_88,(iterator)0x0,
                     (Name *)(pEVar3 + 3));
          pDVar12 = siblingIterators.
                    super__Vector_base<DeepValueIterator,_std::allocator<DeepValueIterator>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          if (___ret == siblingIterators.
                        super__Vector_base<DeepValueIterator,_std::allocator<DeepValueIterator>_>.
                        _M_impl.super__Vector_impl_data._M_start) {
            bVar26 = 1;
          }
          else {
            bVar26 = 1;
            pDVar16 = ___ret;
            do {
              ppEVar18 = deriveParams::DeepValueIterator::operator*(pDVar16);
              deriveParams::DeepValueIterator::operator++(pDVar16);
              pEVar4 = *ppEVar18;
              if (pEVar4->_id != CallId) {
                handle_unreachable("all sibling functions should have the same instruction type",
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/MergeSimilarFunctions.cpp"
                                   ,0x19d);
              }
              uVar5 = pEVar3[3].type.id;
              uVar6 = pEVar4[3].type.id;
              if (names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                  super__Vector_impl_data._M_start ==
                  names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                std::vector<wasm::Name,std::allocator<wasm::Name>>::
                _M_realloc_insert<wasm::Name_const&>
                          ((vector<wasm::Name,std::allocator<wasm::Name>> *)auStack_88,
                           (iterator)
                           names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl
                           .super__Vector_impl_data._M_start,(Name *)(pEVar4 + 3));
              }
              else {
                pcVar9 = (char *)pEVar4[3].type.id;
                ((names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                  super__Vector_impl_data._M_start)->super_IString).str._M_len =
                     *(size_t *)(pEVar4 + 3);
                ((names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                  super__Vector_impl_data._M_start)->super_IString).str._M_str = pcVar9;
                names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                super__Vector_impl_data._M_start =
                     names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                     super__Vector_impl_data._M_start + 1;
              }
              bVar26 = bVar26 & uVar5 == uVar6;
              pDVar16 = pDVar16 + 1;
            } while (pDVar16 != pDVar12);
          }
          std::variant<wasm::Literals,std::vector<wasm::Name,std::allocator<wasm::Name>>>::operator=
                    ((variant<wasm::Literals,std::vector<wasm::Name,std::allocator<wasm::Name>>> *)
                     auStack_138,(vector<wasm::Name,_std::allocator<wasm::Name>_> *)auStack_88);
          goto LAB_007aff91;
        }
        for (; pDVar16 != pDVar12; pDVar16 = pDVar16 + 1) {
          ppEVar18 = deriveParams::DeepValueIterator::operator*(pDVar16);
          if ((*ppEVar18)->_id != ((Expression *)(pNVar17->super_IString).str._M_len)->_id) {
            __assert_fail("(*it)->_id == primary->_id",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/MergeSimilarFunctions.cpp"
                          ,0x1a6,
                          "bool wasm::EquivalentClass::deriveParams(Module *, std::vector<ParamInfo> &, bool)"
                         );
          }
          deriveParams::DeepValueIterator::operator++(pDVar16);
        }
      }
LAB_007b00bf:
      if (auStack_88 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_88,
                        (long)names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)auStack_88);
      }
      std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
                 &values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
      Literal::~Literal((Literal *)&values);
      std::__detail::__variant::
      _Variant_storage<false,_wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
      ::~_Variant_storage((_Variant_storage<false,_wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
                           *)auStack_138);
      deriveParams::DeepValueIterator::operator++((DeepValueIterator *)local_200);
    }
    std::vector<DeepValueIterator,_std::allocator<DeepValueIterator>_>::~vector
              ((vector<DeepValueIterator,_std::allocator<DeepValueIterator>_> *)&__ret);
    if (primaryIt.tasks.fixed._M_elems[9] != (Expression **)0x0) {
      operator_delete(primaryIt.tasks.fixed._M_elems[9],
                      (long)primaryIt.tasks.flexible.
                            super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)primaryIt.tasks.fixed._M_elems[9]);
    }
  }
  return local_98 == (char *)0x0;
}

Assistant:

bool EquivalentClass::deriveParams(Module* module,
                                   std::vector<ParamInfo>& params,
                                   bool isCallIndirectionEnabled) {
  // Allows iteration over children of the root expression recursively.
  struct DeepValueIterator {
    // The DFS work list.
    SmallVector<Expression**, 10> tasks;

    DeepValueIterator(Expression** root) { tasks.push_back(root); }

    void operator++() {
      ChildIterator it(*tasks.back());
      tasks.pop_back();
      for (Expression*& child : it) {
        tasks.push_back(&child);
      }
    }

    Expression*& operator*() {
      assert(!empty());
      return *tasks.back();
    }
    bool empty() { return tasks.empty(); }
  };

  if (primaryFunction->imported()) {
    return false;
  }
  DeepValueIterator primaryIt(&primaryFunction->body);
  std::vector<DeepValueIterator> siblingIterators;
  // Skip the first function, as it is the primary function to compare the
  // primary function with the other functions based on the primary instr type.
  assert(functions.size() >= 2);
  for (auto func = functions.begin() + 1; func != functions.end(); ++func) {
    siblingIterators.emplace_back(&(*func)->body);
  }

  for (; !primaryIt.empty(); ++primaryIt) {
    Expression*& primary = *primaryIt;
    ConstDiff diff;
    Literals values;
    std::vector<Name> names;

    bool isAllSame = true;
    if (auto* primaryConst = primary->dynCast<Const>()) {
      values.push_back(primaryConst->value);
      for (auto& it : siblingIterators) {
        Expression*& sibling = *it;
        ++it;
        if (auto* siblingConst = sibling->dynCast<Const>()) {
          isAllSame &= primaryConst->value == siblingConst->value;
          values.push_back(siblingConst->value);
        } else {
          WASM_UNREACHABLE(
            "all sibling functions should have the same instruction type");
        }
      }
      diff = values;
    } else if (isCallIndirectionEnabled && primary->is<Call>()) {
      auto* primaryCall = primary->dynCast<Call>();
      names.push_back(primaryCall->target);
      for (auto& it : siblingIterators) {
        Expression*& sibling = *it;
        ++it;
        if (auto* siblingCall = sibling->dynCast<Call>()) {
          isAllSame &= primaryCall->target == siblingCall->target;
          names.push_back(siblingCall->target);
        } else {
          WASM_UNREACHABLE(
            "all sibling functions should have the same instruction type");
        }
      }
      diff = names;
    } else {
      // Skip non-constant expressions, which are ensured to be the exactly
      // same.
      for (auto& it : siblingIterators) {
        // Sibling functions in a class should have the same instruction type.
        assert((*it)->_id == primary->_id);
        ++it;
      }
      continue;
    }
    // If all values are the same, skip to parameterize it.
    if (isAllSame) {
      continue;
    }
    // If the derived param is already in the params, reuse it.
    // e.g.
    //
    // ```
    // (func $use-42-twice (result i32)
    //   (i32.add (i32.const 42) (i32.const 42))
    // )
    // (func $use-43-twice (result i32)
    //   (i32.add (i32.const 43) (i32.const 43))
    // )
    // ```
    //
    // will be merged reusing the parameter [42, 43]
    //
    // ```
    // (func $use-42-twice (result i32)
    //  (call $byn$mgfn-shared$use-42-twice (i32.const 42))
    // )
    // (func $use-43-twice (result i32)
    //  (call $byn$mgfn-shared$use-42-twice (i32.const 43))
    // )
    // (func $byn$mgfn-shared$use-42-twice (param $0 i32) (result i32)
    //  (i32.add (local.get $0) (local.get $0))
    // )
    // ```
    //
    bool paramReused = false;
    for (auto& param : params) {
      if (param.values == diff) {
        param.uses.push_back(&primary);
        paramReused = true;
        break;
      }
    }
    if (!paramReused) {
      params.push_back(ParamInfo(diff, {&primary}));
    }
  }
  return true;
}